

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRSystem.cpp
# Opt level: O1

time_t __thiscall MinVR::VRSystem::time(VRSystem *this,time_t *__timer)

{
  timeval now;
  timeval local_20;
  
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  return local_20.tv_sec - (this->start).tv_sec;
}

Assistant:

double VRSystem::time(bool absolute) {
	double timeOffset = 0.0;
	if (absolute) {
		timeOffset = initialTime;
	}

#if defined(WIN32)
        LARGE_INTEGER now;
        QueryPerformanceCounter(&now);

		return ((double)(now.QuadPart - timeStart.QuadPart) /
                counterFrequency.QuadPart) + timeOffset;
#else
        // Linux resolution defaults to 100Hz.
        // There is no need to do a separate RDTSC call as gettimeofday
        // actually uses RDTSC when on systems that support it, otherwise
        // it uses the system clock.
        struct timeval now;
        gettimeofday(&now, NULL);

        return (now.tv_sec  - start.tv_sec) +
            (now.tv_usec - start.tv_usec) / 1e6 + timeOffset;
#endif
}